

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O1

bool __thiscall BuildLog::OpenForWriteIfNeeded(BuildLog *this)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  bool bVar3;
  
  bVar3 = true;
  if ((this->log_file_path_)._M_string_length != 0) {
    __stream = fopen((this->log_file_path_)._M_dataplus._M_p,"ab");
    this->log_file_ = (FILE *)__stream;
    bVar3 = false;
    if ((__stream != (FILE *)0x0) &&
       (iVar1 = setvbuf(__stream,(char *)0x0,1,0x2000), bVar3 = false, iVar1 == 0)) {
      iVar1 = fileno((FILE *)this->log_file_);
      SetCloseOnExec(iVar1);
      fseek((FILE *)this->log_file_,0,2);
      lVar2 = ftell((FILE *)this->log_file_);
      if ((lVar2 == 0) &&
         (iVar1 = fprintf((FILE *)this->log_file_,"# ninja log v%d\n",5), iVar1 < 0)) {
        return false;
      }
      (this->log_file_path_)._M_string_length = 0;
      *(this->log_file_path_)._M_dataplus._M_p = '\0';
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool BuildLog::OpenForWriteIfNeeded() {
  if (log_file_path_.empty()) {
    return true;
  }
  log_file_ = fopen(log_file_path_.c_str(), "ab");
  if (!log_file_) {
    return false;
  }
  if (setvbuf(log_file_, NULL, _IOLBF, BUFSIZ) != 0) {
    return false;
  }
  SetCloseOnExec(fileno(log_file_));

  // Opening a file in append mode doesn't set the file pointer to the file's
  // end on Windows. Do that explicitly.
  fseek(log_file_, 0, SEEK_END);

  if (ftell(log_file_) == 0) {
    if (fprintf(log_file_, kFileSignature, kCurrentVersion) < 0) {
      return false;
    }
  }
  log_file_path_.clear();
  return true;
}